

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHelpers.hpp
# Opt level: O0

SoapySDRRange * callocArrayType<SoapySDRRange>(size_t length)

{
  SoapySDRRange *this;
  undefined8 uVar1;
  size_t in_RDI;
  SoapySDRRange *out;
  
  this = (SoapySDRRange *)calloc(in_RDI,0x18);
  if (this == (SoapySDRRange *)0x0) {
    uVar1 = __cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc((bad_alloc *)this);
    __cxa_throw(uVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  return this;
}

Assistant:

T *callocArrayType(const size_t length)
{
    auto out = (T *)std::calloc(length, sizeof(T));
    if (out == nullptr) throw std::bad_alloc();
    return out;
}